

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9MemObjAdd(jx9_value *pObj1,jx9_value *pObj2,int bAddStore)

{
  jx9_hashmap *pjVar1;
  jx9_hashmap_node *pjVar2;
  jx9_vm *pjVar3;
  void *pvVar4;
  sxi32 sVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  jx9_hashmap *pDest;
  undefined4 in_register_00000014;
  jx9_hashmap_node **ppjVar10;
  double dVar11;
  ulong uVar9;
  
  if (((pObj2->iFlags | pObj1->iFlags) & 0x40U) == 0) {
    jx9MemObjToNumeric(pObj1);
    jx9MemObjToNumeric(pObj2);
    uVar8 = pObj1->iFlags;
    uVar6 = pObj2->iFlags;
    if (((uVar6 | uVar8) & 4) == 0) {
      uVar9 = (pObj2->x).iVal;
      (pObj1->x).pOther = (void *)((long)(pObj1->x).pOther + uVar9);
      pObj1->iFlags = uVar8 & 0xfffffe90 | 2;
    }
    else {
      if ((uVar8 & 4) == 0) {
        jx9MemObjToReal(pObj1);
        uVar6 = pObj2->iFlags;
      }
      if ((uVar6 & 4) == 0) {
        jx9MemObjToReal(pObj2);
      }
      dVar11 = (pObj1->x).rVal + (pObj2->x).rVal;
      (pObj1->x).rVal = dVar11;
      uVar9 = (long)dVar11;
      if (9.223372036854776e+18 < ABS(dVar11)) {
        uVar9 = 0x8000000000000000;
      }
      pObj1->iFlags = pObj1->iFlags & 0xfffffe90U | 4;
      if (uVar9 + 0x7fffffffffffffff < 0xfffffffffffffffe && dVar11 == (double)(long)uVar9) {
        (pObj1->x).iVal = uVar9;
        pObj1->iFlags = 2;
      }
    }
  }
  else {
    if (bAddStore == 0) {
      pDest = jx9NewHashmap(pObj1->pVm,(_func_sxu32_sxi64 *)pObj2,
                            (_func_sxu32_void_ptr_sxu32 *)CONCAT44(in_register_00000014,bAddStore));
      if (pDest == (jx9_hashmap *)0x0) {
LAB_0011f854:
        sVar5 = jx9VmThrowError(pObj1->pVm,(SyString *)0x0,1,
                                "JX9 is running out of memory while creating array");
        return sVar5;
      }
      if ((pObj1->iFlags & 0x40U) == 0) {
        if ((pObj1->iFlags & 0x20U) == 0) {
          HashmapInsert(pDest,(jx9_value *)0x0,pObj1);
        }
      }
      else {
        jx9HashmapDup((jx9_hashmap *)(pObj1->x).pOther,pDest);
      }
    }
    else {
      if ((pObj1->iFlags & 0x40U) == 0) {
        sVar5 = jx9MemObjToHashmap(pObj1);
        if (sVar5 != 0) goto LAB_0011f854;
      }
      pDest = (jx9_hashmap *)(pObj1->x).pOther;
    }
    if ((pObj2->iFlags & 0x40U) == 0) {
      if ((pObj2->iFlags & 0x20U) == 0) {
        HashmapInsert(pDest,(jx9_value *)0x0,pObj2);
      }
    }
    else {
      pjVar1 = (jx9_hashmap *)(pObj2->x).iVal;
      if ((pDest != pjVar1) && (pjVar1->nEntry != 0)) {
        ppjVar10 = &pjVar1->pFirst;
        uVar8 = 0;
        do {
          pjVar2 = *ppjVar10;
          if (pjVar2->iType == 2) {
            sVar5 = HashmapLookupBlobKey
                              (pDest,(pjVar2->xKey).sKey.pBlob,(pjVar2->xKey).sKey.nByte,
                               (jx9_hashmap_node **)0x0);
            if (sVar5 != 0) {
              pjVar3 = pjVar2->pMap->pVm;
              if ((pjVar2->nValIdx < (pjVar3->aMemObj).nUsed) &&
                 (pvVar4 = (pjVar3->aMemObj).pBase, pvVar4 != (void *)0x0)) {
                iVar7 = HashmapInsertBlobKey
                                  (pDest,(pjVar2->xKey).sKey.pBlob,(pjVar2->xKey).sKey.nByte,
                                   (jx9_value *)
                                   ((long)pvVar4 +
                                   (ulong)(pjVar2->nValIdx * (pjVar3->aMemObj).eSize)));
LAB_0011f96f:
                if (iVar7 != 0) break;
              }
            }
          }
          else {
            sVar5 = HashmapLookupIntKey(pDest,(pjVar2->xKey).iKey,(jx9_hashmap_node **)0x0);
            if (sVar5 != 0) {
              pjVar3 = pjVar2->pMap->pVm;
              if ((pjVar2->nValIdx < (pjVar3->aMemObj).nUsed) &&
                 (pvVar4 = (pjVar3->aMemObj).pBase, pvVar4 != (void *)0x0)) {
                iVar7 = HashmapInsertIntKey(pDest,(pjVar2->xKey).iKey,
                                            (jx9_value *)
                                            ((long)pvVar4 +
                                            (ulong)(pjVar2->nValIdx * (pjVar3->aMemObj).eSize)));
                goto LAB_0011f96f;
              }
            }
          }
          ppjVar10 = &pjVar2->pPrev;
          uVar8 = uVar8 + 1;
        } while (uVar8 < pjVar1->nEntry);
      }
    }
    uVar8 = pObj1->iFlags;
    if ((uVar8 & 1) != 0) {
      SyBlobRelease(&pObj1->sBlob);
      uVar8 = pObj1->iFlags;
    }
    (pObj1->x).pOther = pDest;
    uVar8 = uVar8 & 0xfffffe90 | 0x40;
    uVar9 = (ulong)uVar8;
    pObj1->iFlags = uVar8;
  }
  return (sxi32)uVar9;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjAdd(jx9_value *pObj1, jx9_value *pObj2, int bAddStore)
{
	if( ((pObj1->iFlags|pObj2->iFlags) & MEMOBJ_HASHMAP) == 0 ){
			/* Arithemtic operation */
			jx9MemObjToNumeric(pObj1);
			jx9MemObjToNumeric(pObj2);
			if( (pObj1->iFlags|pObj2->iFlags) & MEMOBJ_REAL ){
				/* Floating point arithmetic */
				jx9_real a, b;
				if( (pObj1->iFlags & MEMOBJ_REAL) == 0 ){
					jx9MemObjToReal(pObj1);
				}
				if( (pObj2->iFlags & MEMOBJ_REAL) == 0 ){
					jx9MemObjToReal(pObj2);
				}
				a = pObj1->x.rVal;
				b = pObj2->x.rVal;
				pObj1->x.rVal = a+b;
				MemObjSetType(pObj1, MEMOBJ_REAL);
				/* Try to get an integer representation also */
				MemObjTryIntger(&(*pObj1));
			}else{
				/* Integer arithmetic */
				sxi64 a, b;
				a = pObj1->x.iVal;
				b = pObj2->x.iVal;
				pObj1->x.iVal = a+b;
				MemObjSetType(pObj1, MEMOBJ_INT);
			}
	}else{
		if( (pObj1->iFlags|pObj2->iFlags) & MEMOBJ_HASHMAP ){
			jx9_hashmap *pMap;
			sxi32 rc;
			if( bAddStore ){
				/* Do not duplicate the hashmap, use the left one since its an add&store operation.
				 */
				if( (pObj1->iFlags & MEMOBJ_HASHMAP) == 0 ){				
					/* Force a hashmap cast */
					rc = jx9MemObjToHashmap(pObj1);
					if( rc != SXRET_OK ){
						jx9VmThrowError(pObj1->pVm, 0, JX9_CTX_ERR, "JX9 is running out of memory while creating array");
						return rc;
					}
				}
				/* Point to the structure that describe the hashmap */
				pMap = (jx9_hashmap *)pObj1->x.pOther;
			}else{
				/* Create a new hashmap */
				pMap = jx9NewHashmap(pObj1->pVm, 0, 0);
				if( pMap == 0){
					jx9VmThrowError(pObj1->pVm, 0, JX9_CTX_ERR, "JX9 is running out of memory while creating array");
					return SXERR_MEM;
				}
			}
			if( !bAddStore ){
				if(pObj1->iFlags & MEMOBJ_HASHMAP ){
					/* Perform a hashmap duplication */
					jx9HashmapDup((jx9_hashmap *)pObj1->x.pOther, pMap);
				}else{
					if((pObj1->iFlags & MEMOBJ_NULL) == 0 ){
						/* Simple insertion */
						jx9HashmapInsert(pMap, 0, pObj1);
					}
				}
			}
			/* Perform the union */
			if(pObj2->iFlags & MEMOBJ_HASHMAP ){
				jx9HashmapUnion(pMap, (jx9_hashmap *)pObj2->x.pOther);
			}else{
				if((pObj2->iFlags & MEMOBJ_NULL) == 0 ){
					/* Simple insertion */
					jx9HashmapInsert(pMap, 0, pObj2);
				}
			}
			/* Reflect the change */
			if( pObj1->iFlags & MEMOBJ_STRING ){
				SyBlobRelease(&pObj1->sBlob);
			}
			pObj1->x.pOther = pMap;
			MemObjSetType(pObj1, MEMOBJ_HASHMAP);
		}
	}
	return SXRET_OK;
}